

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O3

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicCmpxchg
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,AtomicCmpxchg *curr,
          optional<wasm::Type> type)

{
  Memory *pMVar1;
  _Storage<wasm::Type,_true> type_00;
  
  type_00 = type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload;
  if ((((ulong)type_00 & 0xfffffffffffffffe) != 2 &
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged) != 1) {
    pMVar1 = Module::getMemory(this->wasm,(Name)(curr->memory).super_IString.str);
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->ptr,(Type)(pMVar1->addressType).id);
    if ((((undefined1  [16])
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type> & (undefined1  [16])0x1) == (undefined1  [16])0x0
        ) && (type_00 = (_Storage<wasm::Type,_true>)0x3, (curr->expected->type).id != 3)) {
      type_00 = (_Storage<wasm::Type,_true>)((ulong)((curr->replacement->type).id == 3) | 2);
    }
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->expected,type_00._M_value);
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->replacement,type_00._M_value);
    return;
  }
  __assert_fail("!type || *type == Type::i32 || *type == Type::i64",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                ,0xcf,
                "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicCmpxchg(AtomicCmpxchg *, std::optional<Type>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
               );
}

Assistant:

void visitAtomicCmpxchg(AtomicCmpxchg* curr,
                          std::optional<Type> type = std::nullopt) {
    assert(!type || *type == Type::i32 || *type == Type::i64);
    notePointer(&curr->ptr, curr->memory);
    if (!type) {
      if (curr->expected->type == Type::i64 ||
          curr->replacement->type == Type::i64) {
        type = Type::i64;
      } else {
        type = Type::i32;
      }
    }
    note(&curr->expected, *type);
    note(&curr->replacement, *type);
  }